

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  UnitTestImpl *pUVar6;
  long lVar7;
  long lVar8;
  TestCase *this;
  long lVar9;
  TestInfo *pTVar10;
  
  iVar3 = UnitTestImpl::failed_test_count(unit_test->impl_);
  if (iVar3 != 0) {
    pUVar6 = unit_test->impl_;
    ppTVar4 = (pUVar6->test_cases_).
              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pUVar6->test_cases_).
                                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
      lVar9 = 0;
      do {
        piVar1 = (pUVar6->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((lVar9 < (int)((ulong)((long)(pUVar6->test_case_indices_).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) &&
           (-1 < piVar1[lVar9])) {
          this = ppTVar4[lVar9];
        }
        else {
          this = (TestCase *)0x0;
        }
        if (this->should_run_ == true) {
          iVar3 = TestCase::failed_test_count(this);
          if ((iVar3 != 0) &&
             (ppTVar5 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_info_list_).
                                     super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >>
                      3))) {
            lVar8 = 0;
            do {
              piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((lVar8 < (int)((ulong)((long)(this->test_indices_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish - (long)piVar1) >>
                                2)) && (lVar7 = (long)piVar1[lVar8], -1 < lVar7)) {
                pTVar10 = ppTVar5[lVar7];
              }
              else {
                pTVar10 = (TestInfo *)0x0;
              }
              if (pTVar10->should_run_ == true) {
                bVar2 = TestResult::Failed(&pTVar10->result_);
                if (bVar2) {
                  ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
                  printf("%s.%s",(this->name_)._M_dataplus._M_p,(pTVar10->name_)._M_dataplus._M_p);
                  PrintFullTestCommentIfPresent
                            ((internal *)
                             (pTVar10->type_param_)._M_t.
                             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t,(TestInfo *)
                                   (pTVar10->value_param_)._M_t.
                                   super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t);
                  putchar(10);
                }
              }
              lVar8 = lVar8 + 1;
              ppTVar5 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar8 < (int)((ulong)((long)(this->test_info_list_).
                                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar5) >> 3));
          }
        }
        lVar9 = lVar9 + 1;
        pUVar6 = unit_test->impl_;
        ppTVar4 = (pUVar6->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar9 < (int)((ulong)((long)(pUVar6->test_cases_).
                                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar4) >> 3));
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Failed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}